

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O2

bool adiak::internal::create_container_type<std::vector<int,_std::allocator<int>_>_>::make_value
               (vector<int,_std::allocator<int>_> *c,adiak_value_t *value,adiak_datatype_t *dtype)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  void *pvVar4;
  long lVar5;
  
  piVar2 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pvVar4 = malloc(((long)piVar3 - (long)piVar2) * 2);
  for (lVar5 = 0; piVar1 = (pointer)((long)piVar2 + lVar5), piVar1 != piVar3; lVar5 = lVar5 + 4) {
    *(int *)((long)pvVar4 + lVar5 * 2) = *piVar1;
  }
  value->v_ptr = pvVar4;
  dtype->num_elements =
       (int)((ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  return true;
}

Assistant:

static bool make_value(T &c, adiak_value_t *value, adiak_datatype_t *dtype) {
            adiak_value_t *valarray = (adiak_value_t *) malloc(sizeof(adiak_value_t) * c.size());
            int j = 0;
            for (typename T::iterator i = c.begin(); i != c.end(); i++) {
               bool result = parse<typename T::value_type>::make_value(*i, valarray + j++, dtype->subtype[0]);               
               if (!result)
                  return false;
            }
            element_type<T>::set(*value, valarray);
            dtype->num_elements = c.size();
            return true;
         }